

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

SetupSendResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcRequest::setupSend
          (SetupSendResult *__return_storage_ptr__,RpcRequest *this,bool isTailCall)

{
  uint *puVar1;
  RpcConnectionState *this_00;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar2;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar3;
  OutgoingRpcMessage *pOVar4;
  Builder payload;
  SourceLocation location;
  Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_> PVar5;
  Refcounted *refcounted;
  Question *this_01;
  ArrayPtr<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> capTable;
  QuestionId questionId;
  SendInternalResult result;
  Vector<int> fds;
  PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  paf;
  Array<unsigned_int> exports;
  QuestionId local_124;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_120;
  SendInternalResult local_118;
  undefined8 in_stack_ffffffffffffff00;
  Disposer *in_stack_ffffffffffffff08;
  QuestionRef *in_stack_ffffffffffffff10;
  ArrayBuilder<int> local_e8;
  char *local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  local_a8;
  Array<int> local_90;
  Array<unsigned_int> local_78;
  Maybe<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>_&> local_60;
  Builder local_58;
  
  local_e8.endPtr = (int *)0x0;
  local_e8.ptr = (int *)0x0;
  local_e8.pos = (RemoveConst<int> *)0x0;
  local_e8.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  this_00 = (this->connectionState).ptr;
  pMVar2 = (this->capTable).table.builder.ptr;
  pRVar3 = (this->capTable).table.builder.pos;
  rpc::Call::Builder::getParams(&local_58,&this->callBuilder);
  local_60.ptr = (HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  payload._builder.capTable = local_58._builder.capTable;
  payload._builder.segment = local_58._builder.segment;
  payload._builder.data = local_58._builder.data;
  payload._builder.pointers = local_58._builder.pointers;
  payload._builder.dataSize = local_58._builder.dataSize;
  payload._builder.pointerCount = local_58._builder.pointerCount;
  payload._builder._38_2_ = local_58._builder._38_2_;
  capTable.size_ = (long)pRVar3 - (long)pMVar2 >> 4;
  capTable.ptr = pMVar2;
  writeDescriptors(&local_78,this_00,capTable,payload,(Vector<int> *)&local_e8,&local_60);
  pOVar4 = (this->message).ptr;
  kj::Vector<int>::releaseAsArray(&local_90,(Vector<int> *)&local_e8);
  (*pOVar4->_vptr_OutgoingRpcMessage[1])(pOVar4,&local_90);
  kj::Array<int>::~Array(&local_90);
  this_01 = anon_unknown_18::
            ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::next
                      (&((this->connectionState).ptr)->questions,&local_124);
  this_01->isAwaitingReturn = true;
  kj::Array<unsigned_int>::operator=(&this_01->paramExports,&local_78);
  this_01->isTailCall = isTailCall;
  local_118.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  local_118.questionRef.disposer = (Disposer *)0x0;
  local_118.questionRef.ptr = (QuestionRef *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++";
  pcStack_b8 = "setupSend";
  local_b0 = 0x1200000a10;
  location.function = (char *)in_stack_ffffffffffffff08;
  location.fileName = (char *)in_stack_ffffffffffffff00;
  location._16_8_ = in_stack_ffffffffffffff10;
  kj::
  newPromiseAndFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>
            (location);
  kj::
  refcounted<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,capnp::_::RpcSystemBase::RpcConnectionState&,unsigned_int&,kj::Own<kj::PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>>,decltype(nullptr)>>
            ((kj *)&stack0xffffffffffffff08,(this->connectionState).ptr,&local_124,
             &local_a8.fulfiller);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::operator=
            (&local_118.questionRef,
             (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             &stack0xffffffffffffff08);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::dispose
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             &stack0xffffffffffffff08);
  (this_01->selfRef).ptr = local_118.questionRef.ptr;
  puVar1 = &((local_118.questionRef.ptr)->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>::
  attach<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
            ((Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>
              *)&local_120,
             (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             &local_a8);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_118.promise,&local_120);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_120);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::dispose
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
             &stack0xffffffffffffff08);
  PVar5.super_PromiseBase.node.ptr = local_118.promise.super_PromiseBase.node.ptr;
  (__return_storage_ptr__->super_SendInternalResult).questionRef.disposer =
       local_118.questionRef.disposer;
  (__return_storage_ptr__->super_SendInternalResult).questionRef.ptr = local_118.questionRef.ptr;
  local_118.questionRef.ptr = (QuestionRef *)0x0;
  local_118.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  (__return_storage_ptr__->super_SendInternalResult).promise.super_PromiseBase.node.ptr =
       (PromiseNode *)PVar5.super_PromiseBase.node.ptr;
  __return_storage_ptr__->questionId = local_124;
  __return_storage_ptr__->question = this_01;
  kj::
  PromiseFulfillerPair<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  ::~PromiseFulfillerPair(&local_a8);
  SendInternalResult::~SendInternalResult(&local_118);
  kj::Array<unsigned_int>::~Array(&local_78);
  kj::ArrayBuilder<int>::dispose(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

SetupSendResult setupSend(bool isTailCall) {
      // Build the cap table.
      kj::Vector<int> fds;
      auto exports = connectionState->writeDescriptors(
          capTable.getTable(), callBuilder.getParams(), fds);
      message->setFds(fds.releaseAsArray());

      // Init the question table.  Do this after writing descriptors to avoid interference.
      QuestionId questionId;
      auto& question = connectionState->questions.next(questionId);
      question.isAwaitingReturn = true;
      question.paramExports = kj::mv(exports);
      question.isTailCall = isTailCall;

      // Make the QuestionRef and result promise.
      SendInternalResult result;
      auto paf = kj::newPromiseAndFulfiller<kj::Promise<kj::Own<RpcResponse>>>();
      result.questionRef = kj::refcounted<QuestionRef>(
          *connectionState, questionId, kj::mv(paf.fulfiller));
      question.selfRef = *result.questionRef;
      result.promise = paf.promise.attach(kj::addRef(*result.questionRef));

      return { kj::mv(result), questionId, question };
    }